

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_writer.c
# Opt level: O2

void nhdp_writer_cleanup(void)

{
  _cleanedup = 1;
  rfc5444_writer_unregister_content_provider
            (&_protocol->writer,&_nhdp_msgcontent_provider,_nhdp_addrtlvs,4);
  rfc5444_writer_unregister_message(&_protocol->writer,_nhdp_message);
  return;
}

Assistant:

void
nhdp_writer_cleanup(void) {
  /* remember we already did shut down the writer */
  _cleanedup = true;

  /* remove pbb writer */
  rfc5444_writer_unregister_content_provider(
    &_protocol->writer, &_nhdp_msgcontent_provider, _nhdp_addrtlvs, ARRAYSIZE(_nhdp_addrtlvs));
  rfc5444_writer_unregister_message(&_protocol->writer, _nhdp_message);
}